

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall
hgdb::json::Module::Module
          (Module *this,string *name,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *remove_func)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *remove_func_local;
  string *name_local;
  Module *this_local;
  
  Scope<hgdb::json::Module>::Scope(&this->super_Scope<hgdb::json::Module>);
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_0058cb00;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ::vector(&this->variables_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  ::vector(&this->instances_);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->remove_inst_,remove_func);
  return;
}

Assistant:

Module(std::string name, std::function<void(const std::string &)> remove_func)
        : name_(std::move(name)), remove_inst_(std::move(remove_func)) {}